

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O3

void QCoreApplication::removePostedEvents(QObject *receiver,int eventType)

{
  QPostEventList *this;
  QAtomicInt *pQVar1;
  undefined8 *puVar2;
  int iVar3;
  QPostEvent *pQVar4;
  QObject *pQVar5;
  long lVar6;
  QEvent *pQVar7;
  QEvent *pQVar8;
  undefined8 uVar9;
  undefined1 *puVar10;
  pointer pQVar11;
  pointer pQVar12;
  iterator iVar13;
  iterator aend;
  QEvent **args;
  long lVar14;
  long lVar15;
  long lVar16;
  long in_FS_OFFSET;
  long local_880;
  QEvent *local_870;
  undefined1 local_868 [24];
  long local_850;
  long local_848;
  undefined1 *local_840;
  undefined1 local_838 [2048];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_868._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_868._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_868._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QCoreApplicationPrivate::lockThreadPostEventList((QPostEventListLocker *)local_868,receiver);
  uVar9 = local_868._0_8_;
  if ((receiver == (QObject *)0x0) ||
     ((((receiver->d_ptr).d)->postedEvents).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
      ._q_value.super___atomic_base<int>._M_i != 0)) {
    memset(local_838,0xaa,0x800);
    local_850 = 0x100;
    local_848 = 0;
    this = (QPostEventList *)(uVar9 + 0x18);
    lVar16 = (((QPostEventList *)(uVar9 + 0x18))->super_QList<QPostEvent>).d.size;
    local_840 = local_838;
    if (lVar16 == 0) {
      local_880 = 0;
    }
    else {
      lVar14 = 8;
      local_880 = 0;
      lVar15 = 0;
      do {
        pQVar4 = (((QPostEventList *)(uVar9 + 0x18))->super_QList<QPostEvent>).d.ptr;
        pQVar5 = *(QObject **)((long)pQVar4 + lVar14 + -8);
        if ((((receiver == (QObject *)0x0) || (pQVar5 == receiver)) &&
            (lVar6 = *(long *)((long)&pQVar4->receiver + lVar14), lVar6 != 0)) &&
           ((eventType == 0 || ((uint)*(ushort *)(lVar6 + 8) == eventType)))) {
          args = (QEvent **)((long)&pQVar4->receiver + lVar14);
          LOCK();
          pQVar1 = &((pQVar5->d_ptr).d)->postedEvents;
          (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          (*args)->m_posted = false;
          if (local_848 == local_850) {
            local_870 = *args;
            QVLABase<QEvent*>::emplace_back_impl<QEvent*>
                      ((QVLABase<QEvent*> *)&local_850,0x100,local_838,&local_870);
          }
          else {
            QVLABase<QEvent*>::emplace_back_impl<QEvent*const&>
                      ((QVLABase<QEvent*> *)&local_850,0x100,local_838,args);
          }
          *args = (QEvent *)0x0;
        }
        else if (((QPostEventList *)(uVar9 + 0x18))->recursion == 0) {
          if (lVar15 != local_880) {
            pQVar11 = QList<QPostEvent>::data((QList<QPostEvent> *)this);
            pQVar12 = QList<QPostEvent>::data((QList<QPostEvent> *)this);
            iVar3 = *(int *)((long)&pQVar11->event + lVar14);
            puVar2 = (undefined8 *)((long)pQVar11 + lVar14 + -8);
            pQVar5 = (QObject *)*puVar2;
            pQVar7 = (QEvent *)puVar2[1];
            *(int *)((long)&pQVar11->event + lVar14) = pQVar12[local_880].priority;
            pQVar8 = pQVar12[local_880].event;
            puVar2 = (undefined8 *)((long)pQVar11 + lVar14 + -8);
            *puVar2 = pQVar12[local_880].receiver;
            puVar2[1] = pQVar8;
            pQVar12[local_880].receiver = pQVar5;
            pQVar12[local_880].event = pQVar7;
            pQVar12[local_880].priority = iVar3;
          }
          local_880 = local_880 + 1;
        }
        lVar15 = lVar15 + 1;
        lVar14 = lVar14 + 0x18;
      } while (lVar16 != lVar15);
    }
    if (((QPostEventList *)(uVar9 + 0x18))->recursion == 0) {
      iVar13 = QList<QPostEvent>::begin((QList<QPostEvent> *)this);
      aend = QList<QPostEvent>::end((QList<QPostEvent> *)this);
      QList<QPostEvent>::erase
                ((QList<QPostEvent> *)this,iVar13.i + local_880,(const_iterator)aend.i);
    }
    std::unique_lock<QMutex>::unlock((unique_lock<QMutex> *)(local_868 + 8));
    puVar10 = local_840;
    if (local_848 != 0) {
      lVar16 = local_848 << 3;
      lVar14 = 0;
      do {
        if (*(long **)(puVar10 + lVar14) != (long *)0x0) {
          (**(code **)(**(long **)(puVar10 + lVar14) + 8))();
        }
        lVar14 = lVar14 + 8;
      } while (lVar16 != lVar14);
    }
    if (local_840 != local_838) {
      QtPrivate::sizedFree(local_840,local_850 << 3);
    }
  }
  std::unique_lock<QMutex>::~unique_lock((unique_lock<QMutex> *)(local_868 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCoreApplication::removePostedEvents(QObject *receiver, int eventType)
{
    auto locker = QCoreApplicationPrivate::lockThreadPostEventList(receiver);
    QThreadData *data = locker.threadData;

    // the QObject destructor calls this function directly.  this can
    // happen while the event loop is in the middle of posting events,
    // and when we get here, we may not have any more posted events
    // for this object.
    if (receiver && !receiver->d_func()->postedEvents.loadAcquire())
        return;

    //we will collect all the posted events for the QObject
    //and we'll delete after the mutex was unlocked
    QVarLengthArray<QEvent*> events;
    qsizetype n = data->postEventList.size();
    qsizetype j = 0;

    for (qsizetype i = 0; i < n; ++i) {
        const QPostEvent &pe = data->postEventList.at(i);

        if ((!receiver || pe.receiver == receiver)
            && (pe.event && (eventType == 0 || pe.event->type() == eventType))) {
            pe.receiver->d_func()->postedEvents.fetchAndSubAcquire(1);
            pe.event->m_posted = false;
            events.append(pe.event);
            const_cast<QPostEvent &>(pe).event = nullptr;
        } else if (!data->postEventList.recursion) {
            if (i != j)
                qSwap(data->postEventList[i], data->postEventList[j]);
            ++j;
        }
    }

#ifdef QT_DEBUG
    if (receiver && eventType == 0) {
        Q_ASSERT(!receiver->d_func()->postedEvents);
    }
#endif

    if (!data->postEventList.recursion) {
        // truncate list
        data->postEventList.erase(data->postEventList.begin() + j, data->postEventList.end());
    }

    locker.unlock();
    qDeleteAll(events);
}